

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O0

void Fxch_ManCompressCubes(Vec_Wec_t *vCubes,Vec_Int_t *vLit2Cube)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p;
  undefined4 local_20;
  int CubeId;
  int k;
  int i;
  Vec_Int_t *vLit2Cube_local;
  Vec_Wec_t *vCubes_local;
  
  local_20 = 0;
  for (CubeId = 0; iVar1 = Vec_IntSize(vLit2Cube), CubeId < iVar1; CubeId = CubeId + 1) {
    iVar1 = Vec_IntEntry(vLit2Cube,CubeId);
    p = Vec_WecEntry(vCubes,iVar1);
    iVar2 = Vec_IntSize(p);
    if (0 < iVar2) {
      Vec_IntWriteEntry(vLit2Cube,local_20,iVar1);
      local_20 = local_20 + 1;
    }
  }
  Vec_IntShrink(vLit2Cube,local_20);
  return;
}

Assistant:

static inline void Fxch_ManCompressCubes( Vec_Wec_t* vCubes,
                                          Vec_Int_t* vLit2Cube )
{
    int i,
        k = 0,
        CubeId;

    Vec_IntForEachEntry( vLit2Cube, CubeId, i )
        if ( Vec_IntSize(Vec_WecEntry(vCubes, CubeId)) > 0 )
            Vec_IntWriteEntry( vLit2Cube, k++, CubeId );

    Vec_IntShrink( vLit2Cube, k );
}